

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool duckdb::BitpackingAnalyze<long>(AnalyzeState *state,Vector *input,idx_t count)

{
  bool bVar1;
  LogicalType *this;
  ulong uVar2;
  idx_t iVar3;
  long *plVar4;
  ulong in_RDX;
  Vector *in_RSI;
  UnifiedVectorFormat *in_RDI;
  Vector *unaff_retaddr;
  idx_t idx;
  idx_t i;
  long *data;
  UnifiedVectorFormat vdata;
  idx_t type_size;
  BitpackingAnalyzeState<long> *analyze_state;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *this_00;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  BitpackingState<long,_long> *this_01;
  ulong local_98;
  PhysicalType in_stack_ffffffffffffff7f;
  SelectionVector *local_78;
  idx_t local_30;
  BitpackingAnalyzeState<long> *local_28;
  ulong local_20;
  Vector *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = AnalyzeState::Cast<duckdb::BitpackingAnalyzeState<long>>
                       ((AnalyzeState *)in_stack_ffffffffffffff30);
  this = Vector::GetType(local_18);
  LogicalType::InternalType(this);
  local_30 = GetTypeIdSize(in_stack_ffffffffffffff7f);
  uVar2 = local_30 << 0xc;
  iVar3 = CompressionInfo::GetBlockSize((CompressionInfo *)0xa830de);
  if (iVar3 < uVar2) {
    bVar5 = 0;
  }
  else {
    this_01 = (BitpackingState<long,_long> *)&stack0xffffffffffffff88;
    UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
    ;
    Vector::ToUnifiedFormat
              (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
    plVar4 = UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&stack0xffffffffffffff88);
    for (local_98 = 0; local_98 < local_20; local_98 = local_98 + 1) {
      iVar3 = SelectionVector::get_index(local_78,local_98);
      in_stack_ffffffffffffff30 = (UnifiedVectorFormat *)&local_28->state;
      this_00 = (TemplatedValidityMask<unsigned_long> *)plVar4[iVar3];
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (this_00,(idx_t)in_stack_ffffffffffffff30);
      bVar1 = BitpackingState<long,_long>::Update<duckdb::EmptyBitpackingWriter>
                        (this_01,CONCAT17(bVar1,in_stack_ffffffffffffff40),
                         SUB81((ulong)this_00 >> 0x38,0));
      if (!bVar1) {
        bVar5 = 0;
        goto LAB_00a83210;
      }
    }
    bVar5 = 1;
LAB_00a83210:
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff30);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool BitpackingAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = state.Cast<BitpackingAnalyzeState<T>>();

	// We use BITPACKING_METADATA_GROUP_SIZE tuples, which can exceed the block size.
	// In that case, we disable bitpacking.
	// we are conservative here by multiplying by 2
	auto type_size = GetTypeIdSize(input.GetType().InternalType());
	if (type_size * BITPACKING_METADATA_GROUP_SIZE * 2 > state.info.GetBlockSize()) {
		return false;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!analyze_state.state.template Update<EmptyBitpackingWriter>(data[idx], vdata.validity.RowIsValid(idx))) {
			return false;
		}
	}
	return true;
}